

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testNativeFormat.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_26e02e::readCopyRead
          (anon_unknown_dwarf_26e02e *this,string *tempDir,char *infilename,uint correctChecksum)

{
  int iVar1;
  int iVar2;
  _Alloc_hider _Var3;
  int iVar4;
  void *pvVar5;
  int *piVar6;
  char *pcVar7;
  long lVar8;
  ostream *poVar9;
  undefined4 *puVar10;
  long lVar11;
  ulong uVar12;
  void *pvVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  char *pcVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  undefined4 uVar27;
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  long local_188;
  ulong local_168;
  string outfilename;
  long local_120;
  long local_118;
  FrameBuffer frameBuffer;
  OutputFile file;
  Header header;
  FrameBuffer frameBuffer_1;
  
  outfilename._M_dataplus._M_p = (pointer)&outfilename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&outfilename,this,this + (long)&tempDir->_M_dataplus);
  std::__cxx11::string::append((char *)&outfilename);
  pvVar5 = operator_new__(8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   reading, ",0xc);
  std::ostream::flush();
  iVar4 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&header,infilename,iVar4);
  piVar6 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
  iVar4 = *piVar6;
  uVar14 = (piVar6[2] - iVar4) + 1;
  iVar18 = piVar6[1];
  lVar25 = (long)piVar6[3] - (long)iVar18;
  local_168 = lVar25 + 1;
  lVar16 = (long)(int)uVar14;
  pcVar7 = (char *)operator_new__(-(ulong)(local_168 * lVar16 >> 0x3d != 0) | local_168 * lVar16 * 8
                                 );
  operator_delete__(pvVar5);
  Imf_3_2::RgbaInputFile::setFrameBuffer
            ((Rgba *)&header,(ulong)(pcVar7 + iVar18 * lVar16 * -8 + (long)iVar4 * -8),1);
  lVar8 = Imf_3_2::RgbaInputFile::dataWindow();
  iVar4 = *(int *)(lVar8 + 4);
  Imf_3_2::RgbaInputFile::dataWindow();
  Imf_3_2::RgbaInputFile::readPixels((int)&header,iVar4);
  if ((int)lVar25 < 0) {
    uVar17 = 0;
  }
  else {
    uVar20 = 0;
    uVar17 = 0;
    pcVar21 = pcVar7;
    do {
      if (0 < (int)uVar14) {
        uVar22 = 0;
        do {
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *(ulong *)(pcVar21 + uVar22 * 8);
          uVar27 = (undefined4)(*(ulong *)(pcVar21 + uVar22 * 8) >> 0x20);
          auVar28._4_4_ = uVar27;
          auVar28._0_4_ = uVar27;
          auVar28._8_4_ = uVar27;
          auVar28._12_4_ = uVar27;
          uVar17 = uVar17 ^ (ushort)(SUB162(auVar28 ^ auVar26,2) ^ SUB162(auVar28 ^ auVar26,0));
          uVar22 = uVar22 + 1;
        } while (uVar14 != uVar22);
      }
      uVar20 = uVar20 + 1;
      pcVar21 = pcVar21 + lVar16 * 8;
    } while (uVar20 != (local_168 & 0xffffffff));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"checksum = ",0xb);
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ostream::flush();
  if (uVar17 != correctChecksum) {
    __assert_fail("checksum == correctChecksum",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                  ,0x40,
                  "void (anonymous namespace)::readImage(const char *, Array2D<Rgba> &, int &, int &, unsigned int)"
                 );
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ok",4);
  std::ostream::flush();
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&header);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  lVar16 = lVar16 * 8;
  lVar8 = 1;
  lVar25 = 8;
  do {
    uVar20 = lVar8 * 8;
    local_120 = 8;
    local_188 = 1;
    local_118 = lVar16;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   x sampling ",0xe)
      ;
      iVar18 = (int)lVar8;
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", y sampling ",0xd);
      iVar19 = (int)local_188;
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar19);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,": writing image, ",0x11);
      std::ostream::flush();
      _Var3 = outfilename._M_dataplus;
      frameBuffer_1._map._M_t._M_impl._0_8_ = 0;
      Imf_3_2::Header::Header
                (&header,uVar14,(int)local_168,1.0,(Vec2 *)&frameBuffer_1,1.0,INCREASING_Y,
                 ZIP_COMPRESSION);
      puVar10 = (undefined4 *)Imf_3_2::Header::compression();
      *puVar10 = 4;
      pcVar21 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&frameBuffer_1,HALF,iVar18,iVar19,false);
      Imf_3_2::ChannelList::insert(pcVar21,(Channel *)0x1bd903);
      pcVar21 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&frameBuffer_1,HALF,iVar18,iVar19,false);
      Imf_3_2::ChannelList::insert(pcVar21,(Channel *)0x1bd916);
      pcVar21 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&frameBuffer_1,HALF,iVar18,iVar19,false);
      Imf_3_2::ChannelList::insert(pcVar21,(Channel *)0x1bd929);
      pcVar21 = (char *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel((Channel *)&frameBuffer_1,HALF,iVar18,iVar19,false);
      Imf_3_2::ChannelList::insert(pcVar21,(Channel *)0x1c771e);
      iVar4 = Imf_3_2::globalThreadCount();
      Imf_3_2::OutputFile::OutputFile(&file,_Var3._M_p,&header,iVar4);
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Slice::Slice
                ((Slice *)&frameBuffer_1,HALF,pcVar7,uVar20,0,iVar18,iVar19,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)0x1bd903);
      Imf_3_2::Slice::Slice
                ((Slice *)&frameBuffer_1,HALF,pcVar7 + 2,uVar20,0,iVar18,iVar19,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)0x1bd916);
      Imf_3_2::Slice::Slice
                ((Slice *)&frameBuffer_1,HALF,pcVar7 + 4,uVar20,0,iVar18,iVar19,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)0x1bd929);
      Imf_3_2::Slice::Slice
                ((Slice *)&frameBuffer_1,HALF,pcVar7 + 6,uVar20,0,iVar18,iVar19,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)0x1c771e);
      if (0 < (int)local_168) {
        local_168 = local_168 & 0xffffffff;
        pcVar21 = pcVar7;
        do {
          lVar11 = Imf_3_2::FrameBuffer::operator[]((char *)&frameBuffer);
          *(char **)(lVar11 + 8) = pcVar21;
          lVar11 = Imf_3_2::FrameBuffer::operator[]((char *)&frameBuffer);
          *(char **)(lVar11 + 8) = pcVar21 + 2;
          lVar11 = Imf_3_2::FrameBuffer::operator[]((char *)&frameBuffer);
          *(char **)(lVar11 + 8) = pcVar21 + 4;
          lVar11 = Imf_3_2::FrameBuffer::operator[]((char *)&frameBuffer);
          *(char **)(lVar11 + 8) = pcVar21 + 6;
          Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&file);
          Imf_3_2::OutputFile::writePixels((int)&file);
          pcVar21 = pcVar21 + lVar16;
          local_168 = local_168 - 1;
        } while (local_168 != 0);
      }
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&frameBuffer);
      Imf_3_2::OutputFile::~OutputFile(&file);
      Imf_3_2::Header::~Header(&header);
      pvVar5 = operator_new__(8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading back, ",0xe)
      ;
      std::ostream::flush();
      _Var3 = outfilename._M_dataplus;
      iVar4 = Imf_3_2::globalThreadCount();
      Imf_3_2::InputFile::InputFile((InputFile *)&frameBuffer,_Var3._M_p,iVar4);
      Imf_3_2::InputFile::header();
      piVar6 = (int *)Imf_3_2::Header::dataWindow();
      iVar4 = *piVar6;
      iVar1 = piVar6[1];
      iVar2 = piVar6[3];
      uVar15 = piVar6[2] - iVar4;
      uVar14 = uVar15 + 1;
      uVar17 = (iVar2 - iVar1) + 1;
      local_168 = (ulong)uVar17;
      lVar11 = (long)(int)uVar14;
      uVar12 = (int)uVar17 * lVar11;
      uVar22 = uVar12 * 8;
      if (0x1fffffffffffffff < uVar12) {
        uVar22 = 0xffffffffffffffff;
      }
      pvVar13 = operator_new__(uVar22);
      operator_delete__(pvVar5);
      frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header;
      frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pcVar21 = (char *)((long)pvVar13 + (long)(int)(uVar14 * iVar1) * -8 + (long)iVar4 * -8);
      uVar22 = (ulong)(int)(iVar19 * uVar14 * 8);
      frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           frameBuffer_1._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Slice::Slice
                ((Slice *)&header,HALF,pcVar21,uVar20,uVar22,iVar18,iVar19,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer_1,(Slice *)0x1bd903);
      Imf_3_2::Slice::Slice
                ((Slice *)&header,HALF,pcVar21 + 2,uVar20,uVar22,iVar18,iVar19,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer_1,(Slice *)0x1bd916);
      Imf_3_2::Slice::Slice
                ((Slice *)&header,HALF,pcVar21 + 4,uVar20,uVar22,iVar18,iVar19,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer_1,(Slice *)0x1bd929);
      Imf_3_2::Slice::Slice
                ((Slice *)&header,HALF,pcVar21 + 6,uVar20,uVar22,iVar18,iVar19,1.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&frameBuffer_1,(Slice *)0x1c771e);
      Imf_3_2::InputFile::setFrameBuffer(&frameBuffer);
      Imf_3_2::InputFile::readPixels((int)&frameBuffer,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing, ",0xb);
      std::ostream::flush();
      if (-1 < iVar2 - iVar1) {
        uVar22 = 0;
        pcVar21 = pcVar7;
        pvVar5 = pvVar13;
        do {
          if (uVar15 < 0x7fffffff) {
            lVar23 = 6;
            lVar24 = 0;
            do {
              if (*(short *)(pcVar21 + lVar23 + -6) != *(short *)((long)pvVar5 + lVar23 + -6)) {
                __assert_fail("pixels2[y][x].r.bits () == pixels[y][x].r.bits ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                              ,0x90,
                              "void (anonymous namespace)::readBackImage(const char *, Array2D<Rgba> &, const Array2D<Rgba> &, int &, int &, const int &, const int &)"
                             );
              }
              if (*(short *)(pcVar21 + lVar23 + -4) != *(short *)((long)pvVar5 + lVar23 + -4)) {
                __assert_fail("pixels2[y][x].g.bits () == pixels[y][x].g.bits ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                              ,0x91,
                              "void (anonymous namespace)::readBackImage(const char *, Array2D<Rgba> &, const Array2D<Rgba> &, int &, int &, const int &, const int &)"
                             );
              }
              if (*(short *)(pcVar21 + lVar23 + -2) != *(short *)((long)pvVar5 + lVar23 + -2)) {
                __assert_fail("pixels2[y][x].b.bits () == pixels[y][x].b.bits ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                              ,0x92,
                              "void (anonymous namespace)::readBackImage(const char *, Array2D<Rgba> &, const Array2D<Rgba> &, int &, int &, const int &, const int &)"
                             );
              }
              if (*(short *)(pcVar21 + lVar23) != *(short *)((long)pvVar5 + lVar23)) {
                __assert_fail("pixels2[y][x].a.bits () == pixels[y][x].a.bits ()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testNativeFormat.cpp"
                              ,0x93,
                              "void (anonymous namespace)::readBackImage(const char *, Array2D<Rgba> &, const Array2D<Rgba> &, int &, int &, const int &, const int &)"
                             );
              }
              lVar24 = lVar24 + lVar8;
              lVar23 = lVar23 + lVar25;
            } while (lVar24 < lVar11);
          }
          uVar22 = uVar22 + local_188;
          pvVar5 = (void *)((long)pvVar5 + local_120 * lVar11);
          pcVar21 = pcVar21 + local_118;
        } while (uVar22 < local_168);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok",2);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      std::ostream::flush();
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&frameBuffer_1);
      Imf_3_2::InputFile::~InputFile((InputFile *)&frameBuffer);
      remove(outfilename._M_dataplus._M_p);
      operator_delete__(pvVar13);
      local_188 = local_188 + 1;
      local_120 = local_120 + 8;
      local_118 = local_118 + lVar16;
    } while (local_188 != 3);
    lVar8 = lVar8 + 1;
    lVar25 = lVar25 + 8;
    if (lVar8 == 3) {
      operator_delete__(pcVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outfilename._M_dataplus._M_p != &outfilename.field_2) {
        operator_delete(outfilename._M_dataplus._M_p,outfilename.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void
readCopyRead (
    const std::string& tempDir,
    const char*        infilename,
    unsigned int       correctChecksum)
{
    std::string outfilename = tempDir + "imf_test_native.exr";

    int                                  w, h;
    Array2D<OPENEXR_IMF_NAMESPACE::Rgba> pixels (1, 1);

    cout << "   reading, " << flush;
    readImage (infilename, pixels, w, h, correctChecksum);
    cout << endl;

    for (int xs = 1; xs <= 2; ++xs)
    {
        for (int ys = 1; ys <= 2; ++ys)
        {
            cout << "   x sampling " << xs << ", y sampling " << ys
                 << ": writing image, " << flush;
            writeImage (outfilename.c_str (), pixels, w, h, xs, ys);

            Array2D<OPENEXR_IMF_NAMESPACE::Rgba> pixels2 (1, 1);
            cout << "reading back, " << flush;
            readBackImage (outfilename.c_str (), pixels2, pixels, w, h, xs, ys);

            remove (outfilename.c_str ());
        }
    }
}